

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

torrent_state * __thiscall
libtorrent::aux::torrent::get_peer_list_state(torrent_state *__return_storage_ptr__,torrent *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  session_settings *psVar4;
  int local_f0;
  external_ip local_b0;
  undefined1 local_19;
  torrent *local_18;
  torrent *this_local;
  torrent_state *ret;
  
  local_19 = 0;
  local_18 = this;
  this_local = (torrent *)__return_storage_ptr__;
  torrent_state::torrent_state(__return_storage_ptr__);
  bVar1 = is_finished(this);
  __return_storage_ptr__->is_finished = bVar1;
  psVar4 = settings(this);
  bVar1 = session_settings::get_bool(psVar4,0x8000);
  __return_storage_ptr__->allow_multiple_connections_per_ip = bVar1;
  bVar1 = is_paused(this);
  if (bVar1) {
    psVar4 = settings(this);
    local_f0 = session_settings::get_int(psVar4,0x4036);
  }
  else {
    psVar4 = settings(this);
    local_f0 = session_settings::get_int(psVar4,0x4035);
  }
  __return_storage_ptr__->max_peerlist_size = local_f0;
  psVar4 = settings(this);
  iVar2 = session_settings::get_int(psVar4,0x4010);
  __return_storage_ptr__->min_reconnect_time = iVar2;
  (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[3])
            (&local_b0);
  external_ip::operator=(&__return_storage_ptr__->ip,&local_b0);
  uVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x20])();
  __return_storage_ptr__->port = uVar3 & 0xffff;
  psVar4 = settings(this);
  iVar2 = session_settings::get_int(psVar4,0x400f);
  __return_storage_ptr__->max_failcount = iVar2;
  return __return_storage_ptr__;
}

Assistant:

torrent_state torrent::get_peer_list_state()
	{
		torrent_state ret;
		ret.is_finished = is_finished();
		ret.allow_multiple_connections_per_ip = settings().get_bool(settings_pack::allow_multiple_connections_per_ip);
		ret.max_peerlist_size = is_paused()
			? settings().get_int(settings_pack::max_paused_peerlist_size)
			: settings().get_int(settings_pack::max_peerlist_size);
		ret.min_reconnect_time = settings().get_int(settings_pack::min_reconnect_time);

		ret.ip = m_ses.external_address();
		ret.port = m_ses.listen_port();
		ret.max_failcount = settings().get_int(settings_pack::max_failcount);
		return ret;
	}